

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arg.cc
# Opt level: O2

void __thiscall
absl::lts_20250127::str_format_internal::anon_unknown_53::IntDigits::PrintAsHexLower<unsigned_char>
          (IntDigits *this,uchar v)

{
  undefined2 uVar1;
  char *pcVar2;
  undefined3 in_register_00000031;
  
  uVar1 = *(undefined2 *)(numbers_internal::kHexTable + (ulong)CONCAT31(in_register_00000031,v) * 2)
  ;
  *(undefined2 *)(this->storage_ + 0x2a) = uVar1;
  pcVar2 = this->storage_ + 0x2a;
  if ((char)uVar1 == '0') {
    pcVar2 = this->storage_ + 0x2b;
  }
  this->start_ = pcVar2;
  this->size_ = (long)this + (0x3c - (long)pcVar2);
  return;
}

Assistant:

void PrintAsHexLower(T v) {
    static_assert(!IsSigned<T>::value, "");
    char *p = storage_ + sizeof(storage_);

    do {
      p -= 2;
      constexpr const char* table = numbers_internal::kHexTable;
      std::memcpy(p, table + 2 * (static_cast<size_t>(v) & 0xFF), 2);
      if (sizeof(T) == 1) break;
      v >>= 8;
    } while (v);
    if (p[0] == '0') {
      // We printed one too many digits.
      ++p;
    }
    start_ = p;
    size_ = static_cast<size_t>(storage_ + sizeof(storage_) - p);
  }